

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_valueConstructor2_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
optTyped_valueConstructor2_Test
          (optTyped_valueConstructor2_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_> *this)

{
  anon_unknown.dwarf_df08::optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::optTyped
            (&this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>);
  (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_001cb868;
  return;
}

Assistant:

TYPED_TEST(optTyped, valueConstructor2)
{
  using opt_type = typename TestFixture::type;
  opt_type o = this->value_1;
  EXPECT_TRUE(o);
  EXPECT_TRUE(o.has_value());
  EXPECT_EQ(this->value_1, *o);
  EXPECT_EQ(this->value_1, o.value());
  EXPECT_EQ(this->value_1, o.value_or(this->value_2));

  const opt_type& co{o};
  EXPECT_TRUE(co);
  EXPECT_TRUE(co.has_value());
  EXPECT_EQ(this->value_1, *co);
  EXPECT_EQ(this->value_1, co.value());
  EXPECT_EQ(this->value_1, co.value_or(this->value_2));
}